

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

void InliningDecider::TraceInlining
               (FunctionBody *inliner,char16 *inlineeName,char16 *inlineeFunctionIdandNumberString,
               uint inlineeByteCodeCount,FunctionBody *topFunc,uint inlinedByteCodeCount,
               FunctionBody *inlinee,uint callSiteId,bool inLoopBody,bool isCallback,uint builtIn)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  uint32 uVar7;
  uint uVar8;
  int iVar9;
  uint32 uVar10;
  undefined4 *puVar11;
  undefined4 extraout_var;
  char16 *pcVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16 *pcVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  char16 *pcVar14;
  FunctionInfo *pFVar15;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char16_t *pcVar16;
  undefined4 in_register_0000008c;
  undefined8 uVar17;
  char16_t *pcVar18;
  char16 local_188 [4];
  char16 debugStringBuffer3 [42];
  wchar local_128 [4];
  char16 debugStringBuffer [42];
  wchar local_c8 [4];
  char16 debugStringBuffer2 [42];
  char16 *local_40;
  
  uVar17 = CONCAT44(in_register_0000008c,inlinedByteCodeCount);
  local_40 = inlineeName;
  if (inlineeName == (char16 *)0x0) {
    local_40 = local_188;
    iVar3 = swprintf_s((char16_t_conflict *)local_40,0x2a,(char16_t_conflict *)L"built In Id: %u",
                       (ulong)builtIn);
    if (iVar3 < 0xf) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0x3b5,"(len > 14)","len > 14");
      if (!bVar2) goto LAB_0055e6d6;
      *puVar11 = 0;
    }
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
  pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar15 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0055e6d6;
    *puVar11 = 0;
    pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,InlinePhase,uVar4,pFVar15->functionId);
  if (bVar2) {
    pcVar16 = L" CALLBACK";
    if (!isCallback) {
      pcVar16 = L"";
    }
    pcVar18 = L" IN LOOP BODY";
    if (!inLoopBody) {
      pcVar18 = L"";
    }
    iVar3 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    uVar5 = Js::FunctionBody::GetCountField(inliner,ByteCodeCount);
    iVar6 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(topFunc);
    register0x00000000 = CONCAT44(extraout_var_01,iVar6);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunc,(wchar (*) [42])local_c8);
    uVar7 = Js::FunctionBody::GetCountField(topFunc,ByteCodeCount);
    Output::Print(L"INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar16,pcVar18,local_40,inlineeFunctionIdandNumberString,inlineeByteCodeCount,
                  CONCAT44(extraout_var,iVar3),pcVar12,CONCAT44(extraout_var_00,uVar5),uVar17,
                  stack0xffffffffffffff90,pcVar13,(ulong)uVar7,(ulong)callSiteId);
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
  pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar15 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0055e6d6;
    *puVar11 = 0;
    pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar15->functionId);
  if (bVar2) {
    pcVar16 = L" CALLBACK";
    if (!isCallback) {
      pcVar16 = L"";
    }
    pcVar18 = L" IN LOOP BODY";
    if (!inLoopBody) {
      pcVar18 = L"";
    }
    iVar3 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    uVar5 = Js::FunctionBody::GetCountField(inliner,ByteCodeCount);
    iVar6 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(topFunc);
    register0x00000000 = CONCAT44(extraout_var_04,iVar6);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)topFunc,(wchar (*) [42])local_c8);
    uVar7 = Js::FunctionBody::GetCountField(topFunc,ByteCodeCount);
    Output::Print(L"INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar16,pcVar18,local_40,inlineeFunctionIdandNumberString,inlineeByteCodeCount,
                  CONCAT44(extraout_var_02,iVar3),pcVar12,CONCAT44(extraout_var_03,uVar5),uVar17,
                  stack0xffffffffffffff90,pcVar13,(ulong)uVar7,(ulong)callSiteId);
    Output::Flush();
  }
  if (builtIn == 0xffffffff) {
    if (inliner == (FunctionBody *)0x0 || inlinee == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0x3c9,"(inliner && inlinee)","inliner && inlinee");
      if (!bVar2) goto LAB_0055e6d6;
      *puVar11 = 0;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
    if (uVar4 == uVar8) {
      return;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
    pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar15 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_0055e6d6;
      *puVar11 = 0;
      pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,InlinePhase,uVar4,pFVar15->functionId);
    if (bVar2) {
      iVar3 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
      pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inlinee,(wchar (*) [42])local_128);
      uVar5 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
      iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_c8);
      uVar7 = Js::FunctionBody::GetCountField(inliner,ByteCodeCount);
      iVar9 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(topFunc);
      pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)topFunc,(wchar (*) [42])local_188);
      uVar10 = Js::FunctionBody::GetCountField(topFunc,ByteCodeCount);
      Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                    ,CONCAT44(extraout_var_05,iVar3),pcVar12,uVar5,CONCAT44(extraout_var_06,iVar6),
                    pcVar13,CONCAT44(extraout_var_07,uVar7),uVar17,CONCAT44(extraout_var_08,iVar9),
                    pcVar14,(ulong)uVar10);
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)topFunc);
    pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar15 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
LAB_0055e6d6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar11 = 0;
      pFVar15 = (topFunc->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,pFVar15->functionId);
    if (bVar2) {
      iVar3 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
      pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inlinee,(wchar (*) [42])local_128);
      uVar5 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
      iVar6 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_c8);
      uVar7 = Js::FunctionBody::GetCountField(inliner,ByteCodeCount);
      iVar9 = (*(topFunc->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(topFunc);
      pcVar14 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)topFunc,(wchar (*) [42])local_188);
      uVar10 = Js::FunctionBody::GetCountField(topFunc,ByteCodeCount);
      Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                    ,CONCAT44(extraout_var_09,iVar3),pcVar12,uVar5,CONCAT44(extraout_var_10,iVar6),
                    pcVar13,(ulong)uVar7,uVar17,CONCAT44(extraout_var_11,iVar9),pcVar14,
                    (ulong)uVar10);
      Output::Flush();
    }
  }
  return;
}

Assistant:

void InliningDecider::TraceInlining(Js::FunctionBody *const inliner, const char16* inlineeName, const char16* inlineeFunctionIdandNumberString, uint inlineeByteCodeCount,
    Js::FunctionBody* topFunc, uint inlinedByteCodeCount, Js::FunctionBody *const inlinee, uint callSiteId, bool inLoopBody, bool isCallback, uint builtIn)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (inlineeName == nullptr)
    {
        int len = swprintf_s(debugStringBuffer3, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u("built In Id: %u"), builtIn);
        Assert(len > 14);
        inlineeName = debugStringBuffer3;
    }
    INLINE_TRACE_AND_TESTTRACE(_u("INLINING%s %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"),
        isCallback ? _u(" CALLBACK") : _u(""),
        inLoopBody ? _u(" IN LOOP BODY") : _u(""),
        inlineeName, inlineeFunctionIdandNumberString, inlineeByteCodeCount,
        inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer), inliner->GetByteCodeCount(),
        inlinedByteCodeCount,
        topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer2), topFunc->GetByteCodeCount(),
        callSiteId
        );

    // Now Trace inlining across files cases

    if (builtIn != -1)  // built-in functions
    {
        return;
    }

    Assert(inliner && inlinee);

    if (inliner->GetSourceContextId() != inlinee->GetSourceContextId())
    {
        INLINE_TRACE_AND_TESTTRACE(_u("INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetByteCodeCount(),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), inliner->GetByteCodeCount(), inlinedByteCodeCount,
            topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3), topFunc->GetByteCodeCount()
            );
    }

}